

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O3

void __thiscall
cmOSXBundleGenerator::cmOSXBundleGenerator(cmOSXBundleGenerator *this,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  cmLocalGenerator *pcVar2;
  
  this->GT = target;
  pcVar1 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar1;
  pcVar2 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar2;
  this->MacContentFolders =
       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  cmGeneratorTarget::HaveWellDefinedOutputFiles(this->GT);
  return;
}

Assistant:

cmOSXBundleGenerator::cmOSXBundleGenerator(cmGeneratorTarget* target)
  : GT(target)
  , Makefile(target->Target->GetMakefile())
  , LocalGenerator(target->GetLocalGenerator())
{
  if (this->MustSkip()) {
    return;
  }
}